

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuleParser.cpp
# Opt level: O2

void __thiscall Refal2::CRuleParser::afterVariableType(CRuleParser *this)

{
  TTokenType TVar1;
  bool bVar2;
  code *pcVar3;
  allocator local_31;
  string local_30;
  
  TVar1 = (this->super_CQualifierParser).token.type;
  if (TVar1 == TT_Qualifier) {
    bVar2 = CModuleBuilder::GetNamedQualifier
                      ((CModuleBuilder *)this,&(this->super_CQualifierParser).token,&this->qualifier
                      );
    if (!bVar2) {
      CParsingElementState::SetWrong(&(this->super_CQualifierParser).super_CParsingElementState);
      return;
    }
    pcVar3 = afterVariableQualifier;
  }
  else {
    if (TVar1 != TT_LeftParen) {
      std::__cxx11::string::string
                ((string *)&local_30,"unexpected token after variable type",&local_31);
      error(this,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      return;
    }
    CQualifierParser::StartQualifer(&this->super_CQualifierParser);
    pcVar3 = variableQualifier;
  }
  this->state = (TState)pcVar3;
  *(undefined8 *)&this->field_0x1e80 = 0;
  return;
}

Assistant:

void CRuleParser::afterVariableType()
{
	if( token.type == TT_LeftParen ) {
		CQualifierParser::StartQualifer();
		state = &CRuleParser::variableQualifier;
	} else if( token.type == TT_Qualifier ) {
		if( CModuleBuilder::GetNamedQualifier( token, qualifier ) ) {
			state = &CRuleParser::afterVariableQualifier;
		} else {
			SetWrong();
		}
	} else {
		error( "unexpected token after variable type" );
	}
}